

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O1

value * __thiscall
mjs::regexp_object::exec(value *__return_storage_ptr__,regexp_object *this,string *str)

{
  regexp_flag rVar1;
  uint uVar2;
  gc_heap *h;
  string *psVar3;
  uint *puVar4;
  void *pvVar5;
  gc_string *pgVar6;
  long *plVar7;
  uint32_t index;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  value *pvVar11;
  double dVar12;
  wstring_view pattern;
  wstring_view str_00;
  vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> match;
  object_ptr res;
  wstring local_128;
  undefined1 local_108 [48];
  vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> local_d8;
  gc_heap_ptr_untyped local_c0;
  value *local_b0;
  gc_heap_ptr_untyped local_a8;
  void *local_98;
  string *local_90;
  string_view local_88;
  wstring_view local_78;
  wstring_view local_68;
  value local_58;
  
  rVar1 = this->flags_;
  uVar8 = 0;
  if ((rVar1 & global) != none) {
    value_representation::get_value
              (&local_58,&this->last_index_,(this->super_native_object).super_object.heap_);
    dVar12 = to_integer(&local_58);
    uVar8 = (uint)dVar12;
  }
  if ((rVar1 & global) != none) {
    value::destroy(&local_58);
  }
  local_108._0_4_ = number;
  local_108._8_8_ = (gc_heap *)0x0;
  value_representation::value_representation((value_representation *)&local_128,(value *)local_108);
  (this->last_index_).repr_ = (uint64_t)local_128._M_dataplus._M_p;
  value::destroy((value *)local_108);
  if (((int)uVar8 < 0) ||
     (puVar4 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str), *puVar4 < uVar8)) {
    value::value(__return_storage_ptr__,(value *)value::null);
    return __return_storage_ptr__;
  }
  local_b0 = __return_storage_ptr__;
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str);
  local_90 = str;
  puVar4 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str);
  uVar2 = *puVar4;
  local_98 = pvVar5;
  pgVar6 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference
                     (&this->source_,(this->super_native_object).super_object.heap_);
  pattern._M_len = (ulong)pgVar6->length_;
  pattern._M_str = (wchar_t *)(pgVar6 + 1);
  regexp::regexp((regexp *)local_108,pattern,this->flags_);
  str_00._M_str = (wchar_t *)((long)pvVar5 + (ulong)uVar8 * 4 + 4);
  str_00._M_len = (ulong)uVar2 - (ulong)uVar8;
  regexp::exec(&local_d8,(regexp *)local_108,str_00);
  regexp::~regexp((regexp *)local_108);
  psVar3 = local_90;
  pvVar11 = local_b0;
  if (local_d8.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_d8.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    value::value(local_b0,(value *)value::null);
  }
  else {
    lVar9 = (long)local_98 + 4;
    if ((rVar1 & global) != none) {
      value_representation::value_representation
                ((value_representation *)local_108,
                 (double)((long)(local_d8.
                                 super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->second - lVar9 >> 2));
      (this->last_index_).repr_ = CONCAT44(local_108._4_4_,local_108._0_4_);
    }
    gc_heap::unsafe_create_from_position<mjs::global_object>
              ((gc_heap *)local_108,(uint32_t)(this->super_native_object).super_object.heap_);
    make_array((gc_heap_ptr<mjs::global_object> *)&local_c0,(uint32_t)local_108);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_108);
    plVar7 = (long *)gc_heap_ptr_untyped::get(&local_c0);
    local_88._M_len = 5;
    local_88._M_str = "input";
    string::string((string *)&local_128,(this->super_native_object).super_object.heap_,&local_88);
    local_108._0_4_ = string;
    local_108._8_8_ = (psVar3->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
    local_108._16_4_ = (psVar3->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
    if ((gc_heap *)local_108._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_108._8_8_,(gc_heap_ptr_untyped *)(local_108 + 8));
    }
    (**(code **)(*plVar7 + 8))(plVar7,&local_128,local_108,0);
    value::destroy((value *)local_108);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_128);
    plVar7 = (long *)gc_heap_ptr_untyped::get(&local_c0);
    local_88._M_len = 5;
    local_88._M_str = "index";
    string::string((string *)&local_128,(this->super_native_object).super_object.heap_,&local_88);
    local_108._8_8_ =
         (undefined8)
         ((long)(local_d8.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>.
                 _M_impl.super__Vector_impl_data._M_start)->first - lVar9 >> 2);
    local_108._0_4_ = number;
    (**(code **)(*plVar7 + 8))(plVar7,&local_128,local_108,0);
    value::destroy((value *)local_108);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_128);
    if ((int)((ulong)((long)local_d8.
                            super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_d8.
                           super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) != 0) {
      lVar9 = 8;
      uVar10 = 0;
      do {
        plVar7 = (long *)gc_heap_ptr_untyped::get(&local_c0);
        h = (this->super_native_object).super_object.heap_;
        index_string_abi_cxx11_(&local_128,(mjs *)(uVar10 & 0xffffffff),index);
        local_68._M_len = local_128._M_string_length;
        local_68._M_str = local_128._M_dataplus._M_p;
        string::string((string *)&local_88,h,&local_68);
        local_78._M_str =
             *(wchar_t **)
              ((long)local_d8.
                     super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar9 + -8);
        local_78._M_len =
             *(long *)((long)&(local_d8.
                               super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + lVar9) -
             (long)local_78._M_str >> 2;
        string::string((string *)&local_a8,(this->super_native_object).super_object.heap_,&local_78)
        ;
        pvVar11 = local_b0;
        local_108._0_4_ = string;
        local_108._8_8_ = local_a8.heap_;
        local_108._16_4_ = local_a8.pos_;
        if (local_a8.heap_ != (gc_heap *)0x0) {
          gc_heap::attach(local_a8.heap_,(gc_heap_ptr_untyped *)(local_108 + 8));
        }
        (**(code **)(*plVar7 + 8))(plVar7,&local_88,(value *)local_108,0);
        value::destroy((value *)local_108);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x10;
      } while (uVar10 < ((ulong)((long)local_d8.
                                       super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_d8.
                                      super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff))
      ;
    }
    pvVar11->type_ = object;
    (pvVar11->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         local_c0.heap_;
    *(uint32_t *)((long)&pvVar11->field_1 + 8) = local_c0.pos_;
    if (local_c0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_c0.heap_,(gc_heap_ptr_untyped *)&(pvVar11->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c0);
  }
  if ((allocation_context *)
      local_d8.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>._M_impl.
      super__Vector_impl_data._M_start == (allocation_context *)0x0) {
    return pvVar11;
  }
  operator_delete(local_d8.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_d8.
                        super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_d8.
                        super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return pvVar11;
}

Assistant:

value exec(const string& str) {
        const bool global = (flags_ & regexp_flag::global) != regexp_flag::none;

        const int32_t start_index = global ? static_cast<int32_t>(to_integer(last_index_.get_value(heap()))) : 0;
        last_index_ = value_representation{value{0.0}};
        if (start_index < 0 || static_cast<size_t>(start_index) > str.view().length()) {
            return value::null;
        }

        const wchar_t* const str_beg = str.view().data();
        const wchar_t* const str_end = str_beg + str.view().length();
        const wchar_t* const search_start = str_beg + start_index;

        const auto match = regexp{source_.dereference(heap()).view(), flags_}.exec(std::wstring_view{search_start, static_cast<size_t>(str_end - search_start)});
        if (match.empty()) {
            return value::null;
        }

        if (global) {
            last_index_ = value_representation{static_cast<double>(match[0].second - str_beg)};
        }

        auto res = make_array(global_.track(heap()), 0);

        res->put(string{heap(), "input"}, value{str});
        res->put(string{heap(), "index"}, value{static_cast<double>(match[0].first - str_beg)});

        for (uint32_t i = 0; i < static_cast<uint32_t>(match.size()); ++i) {
            res->put(string{heap(), index_string(i)}, value{string{heap(), match[i].str()}});
        }

        return value{res};
    }